

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigCanon.c
# Opt level: O2

Aig_RMan_t * Aig_RManStart(void)

{
  int iVar1;
  Aig_RMan_t *pAVar2;
  Aig_Man_t *p;
  Aig_Tru_t **ppAVar3;
  Aig_MmFlex_t *pAVar4;
  Bdc_Man_t *pBVar5;
  
  pAVar2 = (Aig_RMan_t *)calloc(1,0xd78);
  pAVar2->nVars = 0xc;
  p = Aig_ManStart(1000000);
  pAVar2->pAig = p;
  Aig_IthVar(p,0xb);
  iVar1 = Abc_PrimeCudd(5000);
  pAVar2->nBins = iVar1;
  ppAVar3 = (Aig_Tru_t **)calloc((long)iVar1,8);
  pAVar2->pBins = ppAVar3;
  pAVar4 = Aig_MmFlexStart();
  pAVar2->pMemTrus = pAVar4;
  Aig_RManStart::Pars.nVarsMax = 0xc;
  Aig_RManStart::Pars.fVerbose = 0;
  pBVar5 = Bdc_ManAlloc(&Aig_RManStart::Pars);
  pAVar2->pBidec = pBVar5;
  return pAVar2;
}

Assistant:

Aig_RMan_t * Aig_RManStart()
{
    static Bdc_Par_t Pars = {0}, * pPars = &Pars;
    Aig_RMan_t * p;
    p = ABC_ALLOC( Aig_RMan_t, 1 );
    memset( p, 0, sizeof(Aig_RMan_t) );
    p->nVars = RMAN_MAXVARS;
    p->pAig  = Aig_ManStart( 1000000 );
    Aig_IthVar( p->pAig, p->nVars-1 );
    // create hash table
    p->nBins = Abc_PrimeCudd(5000);
    p->pBins = ABC_CALLOC( Aig_Tru_t *, p->nBins );
    p->pMemTrus = Aig_MmFlexStart();
    // bi-decomposition manager
    pPars->nVarsMax = p->nVars;
    pPars->fVerbose = 0;
    p->pBidec = Bdc_ManAlloc( pPars );
    return p;
}